

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O3

Session * __thiscall
FIX::Initiator::getSession(Initiator *this,SessionID *sessionID,Responder *responder)

{
  iterator iVar1;
  Session *pSVar2;
  
  iVar1 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
          ::find(&(this->m_sessions)._M_t,sessionID);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Session *)0x0;
  }
  else {
    Session::setResponder((Session *)iVar1._M_node[0xb]._M_left,responder);
    pSVar2 = (Session *)iVar1._M_node[0xb]._M_left;
  }
  return pSVar2;
}

Assistant:

Session *Initiator::getSession(const SessionID &sessionID, Responder &responder) {
  Sessions::iterator i = m_sessions.find(sessionID);
  if (i != m_sessions.end()) {
    i->second->setResponder(&responder);
    return i->second;
  }
  return 0;
}